

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_predict_threaded.cc
# Opt level: O0

int main(int argc,char **argv)

{
  Worker threadfunc;
  ostream *poVar1;
  vw *pvVar2;
  void *pvVar3;
  ezexample *peVar4;
  ezexample *this;
  ostream *this_00;
  long in_RSI;
  int in_EDI;
  float fVar5;
  float fVar6;
  thread *pt;
  int t;
  thread_group tg;
  Worker w;
  ezexample ex;
  vector<double,_std::allocator<double>_> results;
  vw *vw;
  string vw_init_string_parser;
  string vw_init_string_all;
  int threadcount;
  vw_namespace *in_stack_fffffffffffffa58;
  ezexample *in_stack_fffffffffffffa60;
  thread_group *in_stack_fffffffffffffa70;
  thread_group *in_stack_fffffffffffffa90;
  vw *in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  ezexample *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  char ns;
  undefined7 in_stack_fffffffffffffac0;
  undefined7 uVar7;
  undefined1 in_stack_fffffffffffffac7;
  undefined1 uVar8;
  io_buf *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  Worker local_470;
  thread *local_450;
  int local_444;
  undefined1 in_stack_fffffffffffffbcf;
  vw *in_stack_fffffffffffffbd0;
  Worker local_2f0;
  double local_2d0;
  allocator<char> local_2c1;
  string local_2c0 [32];
  Worker *this_01;
  allocator local_291;
  string local_290 [39];
  vw_namespace local_269;
  double local_268;
  allocator local_259;
  string local_258 [38];
  vw_namespace local_232;
  vw_namespace local_231 [377];
  vector<double,_std::allocator<double>_> local_b8;
  string local_a0 [32];
  vw *local_80;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  int local_4;
  
  uVar8 = (undefined1)((ulong)in_stack_fffffffffffffaa0 >> 0x38);
  local_4 = 0;
  if (in_EDI == 3) {
    local_10 = in_RSI;
    local_14 = atoi(*(char **)(in_RSI + 8));
    runcount = atoi(*(char **)(local_10 + 0x10));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"-t --ldf_override s --quiet -q st --noconstant --hash all -i train.w",
               &local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,
               "-t --ldf_override s --quiet -q st --noconstant --hash all --noop",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::string(local_a0,local_38);
    pvVar2 = VW::initialize(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                            (bool)in_stack_fffffffffffffac7,
                            (trace_message_t)
                            CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                            in_stack_fffffffffffffab0);
    ns = (char)((uint)in_stack_fffffffffffffabc >> 0x18);
    std::__cxx11::string::~string(local_a0);
    local_80 = pvVar2;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x11b81f);
    ezexample::ezexample
              (in_stack_fffffffffffffab0,
               (vw *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),(bool)uVar8,
               in_stack_fffffffffffffa98);
    vw_namespace::vw_namespace(local_231,'s');
    ezexample::operator()(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    vw_namespace::vw_namespace(&local_232,'t');
    ezexample::operator()(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"1",&local_259);
    ezexample::set_label
              (in_stack_fffffffffffffab0,
               (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    fVar5 = ezexample::predict_partial(in_stack_fffffffffffffa60);
    local_268 = (double)fVar5;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa60,
               (value_type_conflict1 *)in_stack_fffffffffffffa58);
    poVar1 = std::operator<<((ostream *)&std::cerr,"should be near zero = ");
    fVar5 = ezexample::predict_partial(in_stack_fffffffffffffa60);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,fVar5);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    ezexample::operator--(in_stack_fffffffffffffa60);
    vw_namespace::vw_namespace(&local_269,'t');
    ezexample::operator()(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    ezexample::operator()
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"1",&local_291);
    ezexample::set_label
              (in_stack_fffffffffffffab0,
               (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    fVar5 = ezexample::predict_partial(in_stack_fffffffffffffa60);
    this_01 = (Worker *)(double)fVar5;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa60,
               (value_type_conflict1 *)in_stack_fffffffffffffa58);
    poVar1 = std::operator<<((ostream *)&std::cerr,"should be near one  = ");
    fVar5 = ezexample::predict_partial(in_stack_fffffffffffffa60);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,fVar5);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    ezexample::operator--(in_stack_fffffffffffffa60);
    ezexample::operator()
              ((ezexample *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),ns,
               (char *)in_stack_fffffffffffffab0);
    peVar4 = ezexample::operator()
                       ((ezexample *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
                        ns,(char *)in_stack_fffffffffffffab0);
    ezexample::operator()
              ((ezexample *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),ns,
               (char *)in_stack_fffffffffffffab0);
    uVar7 = SUB87(&local_2c1,0);
    uVar8 = (undefined1)((ulong)&local_2c1 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"1",(allocator *)CONCAT17(uVar8,uVar7));
    ezexample::set_label
              (in_stack_fffffffffffffab0,
               (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    fVar5 = ezexample::predict_partial(in_stack_fffffffffffffa60);
    local_2d0 = (double)fVar5;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa60,
               (value_type_conflict1 *)in_stack_fffffffffffffa58);
    poVar1 = std::operator<<((ostream *)&std::cerr,"should be near one  = ");
    fVar6 = ezexample::predict_partial(in_stack_fffffffffffffa60);
    this = (ezexample *)std::ostream::operator<<(poVar1,fVar6);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    ezexample::~ezexample(this);
    if (local_14 == 0) {
      Worker::Worker(&local_2f0,local_80,&local_70,&local_b8);
      Worker::operator()(this_01);
    }
    else {
      boost::thread_group::thread_group(in_stack_fffffffffffffa70);
      for (local_444 = 0; local_444 < local_14; local_444 = local_444 + 1) {
        this_00 = std::operator<<((ostream *)&std::cerr,"starting thread ");
        in_stack_fffffffffffffa90 = (thread_group *)std::ostream::operator<<(this_00,local_444);
        std::ostream::operator<<(in_stack_fffffffffffffa90,std::endl<char,std::char_traits<char>>);
        Worker::Worker(&local_470,local_80,&local_70,&local_b8);
        threadfunc.m_vw_parser._0_4_ = in_stack_fffffffffffffab8;
        threadfunc.m_vw = (vw *)poVar1;
        threadfunc.m_vw_parser._4_4_ = fVar5;
        threadfunc.m_referenceValues._0_7_ = uVar7;
        threadfunc.m_referenceValues._7_1_ = uVar8;
        threadfunc.vw_init_string = (string *)peVar4;
        in_stack_fffffffffffffa70 = (thread_group *)local_470.vw_init_string;
        local_450 = boost::thread_group::create_thread<Worker>((thread_group *)this,threadfunc);
      }
      boost::thread_group::join_all(in_stack_fffffffffffffa90);
      poVar1 = std::operator<<((ostream *)&std::cerr,"finished!");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      boost::thread_group::~thread_group(in_stack_fffffffffffffa70);
    }
    VW::finish(in_stack_fffffffffffffbd0,(bool)in_stack_fffffffffffffbcf);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"need two args: threadcount runcount");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{ if (argc != 3)
  { cerr << "need two args: threadcount runcount" << endl;
    return 1;
  }
  int threadcount = atoi(argv[1]);
  runcount = atoi(argv[2]);
  // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE -- THIS READS IN A MODEL FROM train.w
  string vw_init_string_all    = "-t --ldf_override s --quiet -q st --noconstant --hash all -i train.w";
  string vw_init_string_parser = "-t --ldf_override s --quiet -q st --noconstant --hash all --noop";   // this needs to have enough arguments to get the parser right
  vw*vw = VW::initialize(vw_init_string_all);
  vector<double> results;

  // HAL'S SPIFFY INTERFACE USING C++ CRAZINESS
  { ezexample ex(vw, false);
    ex(vw_namespace('s'))
    ("p^the_man")
    ("w^the")
    ("w^man")
    (vw_namespace('t'))
    ("p^le_homme")
    ("w^le")
    ("w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near zero = " << ex.predict_partial() << endl;

    --ex;   // remove the most recent namespace
    ex(vw_namespace('t'))
    ("p^un_homme")
    ("w^un")
    ("w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near one  = " << ex.predict_partial() << endl;

    --ex;   // remove the most recent namespace
    // add features with explicit ns
    ex('t', "p^un_homme")
    ('t', "w^un")
    ('t', "w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near one  = " << ex.predict_partial() << endl;
  }

  if (threadcount == 0)
  { Worker w(*vw, vw_init_string_parser, results);
    w();
  }
  else
  { boost::thread_group tg;
    for (int t = 0; t < threadcount; ++t)
    { cerr << "starting thread " << t << endl;
      boost::thread * pt = tg.create_thread(Worker(*vw, vw_init_string_parser, results));
    }
    tg.join_all();
    cerr << "finished!" << endl;
  }


  // AND FINISH UP
  VW::finish(*vw);
}